

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QRectF>::reallocateAndGrow
          (QArrayDataPointer<QRectF> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QRectF> *old)

{
  long lVar1;
  bool bVar2;
  QGenericArrayOps<QRectF> *this_00;
  QRectF *b;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  QArrayDataPointer<QRectF> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QRectF> dp;
  undefined4 in_stack_ffffffffffffff78;
  AllocationOption in_stack_ffffffffffffff7c;
  QRectF *in_stack_ffffffffffffff80;
  QRectF *in_stack_ffffffffffffff88;
  QGenericArrayOps<QRectF> *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((in_ESI != 0) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QRectF> *)in_stack_ffffffffffffff80), bVar2)) ||
     (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QRectF> *)&DAT_aaaaaaaaaaaaaaaa,-0x5555555555555556,0xaaaaaaaa);
    if (0 < in_RDX) {
      qt_noop();
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QRectF> *)in_stack_ffffffffffffff80);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QRectF> *)
                  operator->((QArrayDataPointer<QRectF> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QRectF> *)0x9addbc);
        begin((QArrayDataPointer<QRectF> *)0x9addcb);
        QtPrivate::QGenericArrayOps<QRectF>::copyAppend
                  (this_00,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
      }
      else {
        in_stack_ffffffffffffff80 =
             (QRectF *)operator->((QArrayDataPointer<QRectF> *)&stack0xffffffffffffffe0);
        b = begin((QArrayDataPointer<QRectF> *)0x9ade04);
        begin((QArrayDataPointer<QRectF> *)0x9ade13);
        QtPrivate::QGenericArrayOps<QRectF>::moveAppend
                  (in_stack_ffffffffffffff90,b,in_stack_ffffffffffffff80);
      }
    }
    swap((QArrayDataPointer<QRectF> *)in_stack_ffffffffffffff80,
         (QArrayDataPointer<QRectF> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78))
    ;
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QRectF> *)in_stack_ffffffffffffff80,
           (QArrayDataPointer<QRectF> *)
           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    }
    ~QArrayDataPointer((QArrayDataPointer<QRectF> *)in_stack_ffffffffffffff80);
  }
  else {
    operator->(in_RDI);
    constAllocatedCapacity((QArrayDataPointer<QRectF> *)in_stack_ffffffffffffff80);
    freeSpaceAtEnd((QArrayDataPointer<QRectF> *)in_stack_ffffffffffffff88);
    QtPrivate::QMovableArrayOps<QRectF>::reallocate
              ((QMovableArrayOps<QRectF> *)in_stack_ffffffffffffff88,
               (qsizetype)in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }